

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O3

double __thiscall FIR::filter(FIR *this,double x)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar1 = this->taps;
  uVar5 = (ulong)iVar1;
  uVar6 = uVar5;
  iVar3 = iVar1;
  if (1 < (long)uVar5) {
    do {
      lVar4 = (long)this->taps;
      if ((long)(uVar6 - 2) < lVar4) {
        fVar7 = (this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6 - 2];
      }
      else {
        puts("\nThat value does not exist");
        lVar4 = (long)this->taps;
        fVar7 = 0.0;
      }
      if (lVar4 < (long)uVar6) {
        puts("\nThat index for the buffer does not exist");
      }
      else {
        (this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6 - 1] = fVar7;
      }
      bVar2 = 2 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
    iVar3 = this->taps;
  }
  if (iVar3 < 1) {
    puts("\nThat index for the buffer does not exist");
  }
  else {
    *(this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = (float)x;
  }
  dVar9 = 0.0;
  if (0 < iVar1) {
    uVar6 = 0;
    do {
      lVar4 = (long)this->taps;
      if ((long)uVar6 < lVar4) {
        dVar10 = (double)(this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6];
      }
      else {
        puts("\nThat value does not exist");
        lVar4 = (long)this->taps;
        dVar10 = 0.0;
      }
      if ((long)uVar6 < lVar4) {
        dVar8 = (double)(this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
      }
      else {
        puts("\nThat coefficient does not exist");
        dVar8 = 0.0;
      }
      dVar9 = dVar9 + dVar10 * dVar8;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  return dVar9;
}

Assistant:

double FIR::filter(double x){

	double output=0.0;
	
	int M = this->getTaps();

	for (int i=M-1; i>0; i--){this->setBuffer(this->getBuffer(i-1),i);}
	
	this->setBuffer(x,0);
	
	for (int i=0; i<M; i++){output+=(this->getBuffer(i))*(this->getCoeff(i));}

	return output;	

}